

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  FieldMetadata *md;
  bool bVar1;
  CodedOutputStream *output_00;
  FieldMetadata *md_00;
  void *in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  uint8 *ptr;
  FieldMetadata *field_metadata;
  int i;
  SpecialSerializer func;
  undefined4 in_stack_00000030;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  FieldMetadata *md_01;
  
  md_01 = (FieldMetadata *)0x0;
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    md = (FieldMetadata *)(in_RSI + (long)iVar2 * 0x18);
    output_00 = (CodedOutputStream *)((long)in_RDI + (ulong)md->offset);
    md_00 = (FieldMetadata *)(ulong)md->type;
    switch(md_00) {
    case (FieldMetadata *)0x0:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc5da);
      }
      break;
    case (FieldMetadata *)0x1:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc6aa);
      }
      break;
    case (FieldMetadata *)0x2:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc77a);
      }
      break;
    case (FieldMetadata *)0x3:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc84a);
      }
      break;
    case (FieldMetadata *)0x4:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc91a);
      }
      break;
    case (FieldMetadata *)0x5:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc9ea);
      }
      break;
    case (FieldMetadata *)0x6:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcaba);
      }
      break;
    case (FieldMetadata *)0x7:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcb8a);
      }
      break;
    case (FieldMetadata *)0x8:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcc5a);
      }
      break;
    case (FieldMetadata *)0x9:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcd2a);
      }
      break;
    case (FieldMetadata *)0xa:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcdfa);
      }
      break;
    case (FieldMetadata *)0xb:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bceca);
      }
      break;
    case (FieldMetadata *)0xc:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcf9a);
      }
      break;
    case (FieldMetadata *)0xd:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd06a);
      }
      break;
    case (FieldMetadata *)0xe:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd13a);
      }
      break;
    case (FieldMetadata *)0xf:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd20a);
      }
      break;
    case (FieldMetadata *)0x10:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd2da);
      }
      break;
    case (FieldMetadata *)0x11:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd3aa);
      }
      break;
    default:
      SerializeNotImplemented(field_metadata._4_4_);
      break;
    case (FieldMetadata *)0x14:
      bVar1 = IsPresent(in_RDI,md->has_offset);
      if (bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd47a);
      }
      break;
    case (FieldMetadata *)0x15:
      bVar1 = IsNull<1>(output_00);
      if (!bVar1) {
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc608);
      }
      break;
    case (FieldMetadata *)0x16:
      bVar1 = IsNull<2>(output_00);
      if (!bVar1) {
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc6d8);
      }
      break;
    case (FieldMetadata *)0x17:
      bVar1 = IsNull<3>(output_00);
      if (!bVar1) {
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc7a8);
      }
      break;
    case (FieldMetadata *)0x18:
      bVar1 = IsNull<4>(output_00);
      if (!bVar1) {
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc878);
      }
      break;
    case (FieldMetadata *)0x19:
      bVar1 = IsNull<5>(output_00);
      if (!bVar1) {
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc948);
      }
      break;
    case (FieldMetadata *)0x1a:
      bVar1 = IsNull<6>(output_00);
      if (!bVar1) {
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bca18);
      }
      break;
    case (FieldMetadata *)0x1b:
      bVar1 = IsNull<7>(output_00);
      if (!bVar1) {
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcae8);
      }
      break;
    case (FieldMetadata *)0x1c:
      bVar1 = IsNull<8>(output_00);
      if (!bVar1) {
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcbb8);
      }
      break;
    case (FieldMetadata *)0x1d:
      bVar1 = IsNull<9>((void *)0x3bcc69);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcc88);
      }
      break;
    case (FieldMetadata *)0x1e:
      bVar1 = IsNull<10>((void *)0x3bcd39);
      if (!bVar1) {
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcd58);
      }
      break;
    case (FieldMetadata *)0x1f:
      bVar1 = IsNull<11>((void *)0x3bce09);
      if (!bVar1) {
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bce28);
      }
      break;
    case (FieldMetadata *)0x20:
      bVar1 = IsNull<12>((void *)0x3bced9);
      if (!bVar1) {
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcef8);
      }
      break;
    case (FieldMetadata *)0x21:
      bVar1 = IsNull<13>(output_00);
      if (!bVar1) {
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcfc8);
      }
      break;
    case (FieldMetadata *)0x22:
      bVar1 = IsNull<14>(output_00);
      if (!bVar1) {
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd098);
      }
      break;
    case (FieldMetadata *)0x23:
      bVar1 = IsNull<15>(output_00);
      if (!bVar1) {
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd168);
      }
      break;
    case (FieldMetadata *)0x24:
      bVar1 = IsNull<16>(output_00);
      if (!bVar1) {
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd238);
      }
      break;
    case (FieldMetadata *)0x25:
      bVar1 = IsNull<17>(output_00);
      if (!bVar1) {
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd308);
      }
      break;
    case (FieldMetadata *)0x26:
      bVar1 = IsNull<18>(output_00);
      if (!bVar1) {
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd3d8);
      }
      break;
    case (FieldMetadata *)0x29:
      bVar1 = IsNull<21>((void *)0x3bd489);
      if (!bVar1) {
        SingularFieldHelper<21>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd4a8);
      }
      break;
    case (FieldMetadata *)0x2a:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x2b:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x2c:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x2d:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x2e:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x2f:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x30:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x31:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x32:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x33:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x34:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x35:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x36:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x37:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x38:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x39:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x3a:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x3b:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x3e:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),md,output_00);
      break;
    case (FieldMetadata *)0x3f:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x40:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x41:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x42:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x43:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x44:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x45:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x46:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x47:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (FieldMetadata *)0x48:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (FieldMetadata *)0x49:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (FieldMetadata *)0x4a:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (FieldMetadata *)0x4b:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x4c:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x4d:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x4e:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x4f:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x50:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (in_RCX,md_01,(CodedOutputStream *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
      break;
    case (FieldMetadata *)0x53:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                ((void *)CONCAT44(num_fields,in_stack_00000030),(FieldMetadata *)output,
                 (CodedOutputStream *)func);
      break;
    case (FieldMetadata *)0x54:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc676);
      }
      break;
    case (FieldMetadata *)0x55:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc746);
      }
      break;
    case (FieldMetadata *)0x56:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc816);
      }
      break;
    case (FieldMetadata *)0x57:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc8e6);
      }
      break;
    case (FieldMetadata *)0x58:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bc9b6);
      }
      break;
    case (FieldMetadata *)0x59:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bca86);
      }
      break;
    case (FieldMetadata *)0x5a:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcb56);
      }
      break;
    case (FieldMetadata *)0x5b:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcc26);
      }
      break;
    case (FieldMetadata *)0x5c:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bccf6);
      }
      break;
    case (FieldMetadata *)0x5d:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcdc6);
      }
      break;
    case (FieldMetadata *)0x5e:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bce96);
      }
      break;
    case (FieldMetadata *)0x5f:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<12>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bcf66);
      }
      break;
    case (FieldMetadata *)0x60:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd036);
      }
      break;
    case (FieldMetadata *)0x61:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd106);
      }
      break;
    case (FieldMetadata *)0x62:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd1d6);
      }
      break;
    case (FieldMetadata *)0x63:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd2a6);
      }
      break;
    case (FieldMetadata *)0x64:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd376);
      }
      break;
    case (FieldMetadata *)0x65:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd446);
      }
      break;
    case (FieldMetadata *)0x68:
      bVar1 = IsOneofPresent(in_RDI,md->has_offset,md->tag);
      if (bVar1) {
        OneOfFieldHelper<21>::Serialize<google::protobuf::io::CodedOutputStream>
                  (output_00,md_00,(CodedOutputStream *)0x3bd510);
      }
      break;
    case (FieldMetadata *)0x69:
      md_01 = (FieldMetadata *)md->ptr;
      (*(code *)md_01)(in_RDI,md->offset,md->tag,md->has_offset,in_RCX);
    }
  }
  return;
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}